

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-rand.c
# Opt level: O0

int Rand_sample(int mean,int upper,int lower,int stand_u,int stand_l)

{
  int16_t iVar1;
  undefined4 local_20;
  int pick;
  int stand_l_local;
  int stand_u_local;
  int lower_local;
  int upper_local;
  int mean_local;
  
  iVar1 = Rand_normal(0,1000);
  local_20 = (int)iVar1;
  if (local_20 < 1) {
    if (local_20 < 0) {
      local_20 = ((mean - lower) * local_20) / (stand_l * 100);
    }
  }
  else {
    local_20 = ((upper - mean) * local_20) / (stand_u * 100);
  }
  return mean + local_20;
}

Assistant:

int Rand_sample(int mean, int upper, int lower, int stand_u, int stand_l)
{
	int pick = Rand_normal(0, 1000);

	/* Scale to fit */
	if (pick > 0) {
		/* Positive pick, scale up */
		pick *= (upper - mean);
		pick /= (100 * stand_u);
	} else if (pick < 0) {
		/* Negative pick, scale down */
		pick *= (mean - lower);
		pick /= (100 * stand_l);
	}

	return mean + pick;
}